

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::sampleMaskToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *bitfield,int numBits)

{
  string *psVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)bitfield);
  psVar1 = (string *)((ulong)(*(long *)(this + 8) - *(long *)this) >> 2);
  if (0 < (int)psVar1) {
    uVar4 = (int)bitfield - 1;
    psVar1 = (string *)0x0;
    do {
      lVar3 = 0;
      uVar2 = uVar4;
      do {
        if ((int)uVar2 < 0) {
          return psVar1;
        }
        if ((*(uint *)(*(long *)this + (long)psVar1 * 4) >> ((uint)lVar3 & 0x1f) & 1) != 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = '1';
        }
        lVar3 = lVar3 + 1;
        uVar2 = uVar2 - 1;
      } while (lVar3 != 0x20);
      psVar1 = (string *)((long)&(psVar1->_M_dataplus)._M_p + 1);
      uVar4 = uVar4 - 0x20;
    } while ((long)psVar1 < (long)(int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 2));
  }
  return psVar1;
}

Assistant:

static std::string sampleMaskToString (const std::vector<deUint32>& bitfield, int numBits)
{
	std::string result(numBits, '0');

	// move from back to front and set chars to 1
	for (int wordNdx = 0; wordNdx < (int)bitfield.size(); ++wordNdx)
	{
		for (int bit = 0; bit < 32; ++bit)
		{
			const int targetCharNdx = numBits - (wordNdx*32+bit) - 1;

			// beginning of the string reached
			if (targetCharNdx < 0)
				return result;

			if ((bitfield[wordNdx] >> bit) & 0x01)
				result[targetCharNdx] = '1';
		}
	}

	return result;
}